

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BVH *bvh;
  size_t sVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  vfloat_impl<4> vVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  vbool<4> vVar38;
  bool bVar39;
  uint uVar40;
  undefined4 uVar41;
  int iVar42;
  AABBNodeMB4D *node1;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  size_t i;
  long lVar50;
  NodeRef root;
  size_t sVar51;
  ulong uVar52;
  vuint<4> *v;
  long lVar53;
  NodeRef *pNVar54;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar78;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  undefined1 in_ZMM0 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  vint4 ai;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar108;
  float fVar109;
  vint4 ai_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar124;
  float fVar125;
  vint4 ai_3;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  vint4 bi;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  float fVar156;
  float fVar157;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 bi_3;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  vint4 bi_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  uint uVar167;
  float fVar168;
  uint uVar170;
  float fVar171;
  uint uVar172;
  float fVar173;
  undefined1 auVar169 [16];
  uint uVar174;
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  undefined1 local_3928 [16];
  QuadMesh *mesh;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_3888 [16];
  undefined8 local_3868;
  undefined8 uStack_3860;
  undefined1 local_3858 [16];
  undefined1 local_3848 [8];
  float fStack_3840;
  float fStack_383c;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_37a8 [16];
  vbool<4> terminated;
  undefined1 local_3768 [8];
  float fStack_3760;
  float fStack_375c;
  vint<4> itime;
  undefined8 local_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 uStack_3700;
  vfloat<4> t;
  vfloat<4> v_2;
  vfloat<4> u;
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined1 local_3668 [8];
  float fStack_3660;
  float fStack_365c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar20 = mm_lookupmask_ps._248_8_;
  uVar19 = mm_lookupmask_ps._240_8_;
  uVar18 = mm_lookupmask_ps._8_8_;
  uVar17 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar99 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar65 = vpcmpeqd_avx(auVar99,(undefined1  [16])valid_i->field_0);
    auVar57 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57,5);
    auVar79 = auVar65 & auVar10;
    if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar79[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar65);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar176._8_4_ = 0x7fffffff;
      auVar176._0_8_ = 0x7fffffff7fffffff;
      auVar176._12_4_ = 0x7fffffff;
      auVar65 = vandps_avx(auVar176,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar165._8_4_ = 0x219392ef;
      auVar165._0_8_ = 0x219392ef219392ef;
      auVar165._12_4_ = 0x219392ef;
      auVar65 = vcmpps_avx(auVar65,auVar165,1);
      auVar79 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar165,auVar65)
      ;
      auVar65 = vandps_avx(auVar176,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vcmpps_avx(auVar65,auVar165,1);
      auVar112 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar165,auVar65
                              );
      auVar65 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar176);
      auVar65 = vcmpps_avx(auVar65,auVar165,1);
      auVar65 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar165,auVar65)
      ;
      auVar113 = vrcpps_avx(auVar79);
      auVar166._8_4_ = 0x3f800000;
      auVar166._0_8_ = 0x3f8000003f800000;
      auVar166._12_4_ = 0x3f800000;
      auVar79 = vfnmadd213ps_fma(auVar79,auVar113,auVar166);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar79,auVar113,auVar113);
      auVar79 = vrcpps_avx(auVar112);
      auVar112 = vfnmadd213ps_fma(auVar112,auVar79,auVar166);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar112,auVar79,auVar79);
      auVar79 = vrcpps_avx(auVar65);
      auVar65 = vfnmadd213ps_fma(auVar65,auVar79,auVar166);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar65,auVar79,auVar79)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar57,1);
      auVar79._8_4_ = 0x20;
      auVar79._0_8_ = 0x2000000020;
      auVar79._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar65,auVar79);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar57,5);
      auVar112._8_4_ = 0x40;
      auVar112._0_8_ = 0x4000000040;
      auVar112._12_4_ = 0x40;
      auVar127._8_4_ = 0x60;
      auVar127._0_8_ = 0x6000000060;
      auVar127._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar127,auVar112,auVar65);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar57,5);
      auVar113._8_4_ = 0x80;
      auVar113._0_8_ = 0x8000000080;
      auVar113._12_4_ = 0x80;
      auVar128._8_4_ = 0xa0;
      auVar128._0_8_ = 0xa0000000a0;
      auVar128._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar128,auVar113,auVar65);
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar57);
      auVar79 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar186 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar65,auVar10);
      auVar87 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar65,auVar79,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar99._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar99._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar99._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar99._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar47 = 3;
      }
      else {
        uVar47 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar54 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar55 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01640d98:
      do {
        do {
          root.ptr = pNVar54[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_016423a3;
          pNVar54 = pNVar54 + -1;
          paVar55 = paVar55 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar55->v;
          auVar191 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar99 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar40 = vmovmskps_avx(auVar99);
        } while (uVar40 == 0);
        uVar43 = (ulong)(uVar40 & 0xff);
        uVar40 = POPCOUNT(uVar40 & 0xff);
        if (uVar47 < uVar40) {
LAB_01640ddb:
          do {
            vVar38.field_0 = terminated.field_0;
            sVar51 = 8;
            lVar48 = -0x20;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_016423a3;
              auVar99 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar191._0_16_,6);
              if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar99[0xf]) goto LAB_01640d98;
              local_37a8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_37a8._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_37a8._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar48 = 0;
              goto LAB_01641079;
            }
            uVar43 = root.ptr & 0xfffffffffffffff0;
            auVar99 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar191._0_16_,6);
            auVar65 = auVar186._0_16_;
            for (; (auVar191 = ZEXT1664(auVar65), lVar48 != 0 &&
                   (sVar6 = *(size_t *)(uVar43 + 0x40 + lVar48 * 2), sVar6 != 8));
                lVar48 = lVar48 + 4) {
              uVar41 = *(undefined4 *)(uVar43 + 0x120 + lVar48);
              auVar101._4_4_ = uVar41;
              auVar101._0_4_ = uVar41;
              auVar101._8_4_ = uVar41;
              auVar101._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0x60 + lVar48);
              auVar88._4_4_ = uVar41;
              auVar88._0_4_ = uVar41;
              auVar88._8_4_ = uVar41;
              auVar88._12_4_ = uVar41;
              auVar79 = *(undefined1 (*) [16])(ray + 0x70);
              auVar57 = vfmadd231ps_fma(auVar88,auVar79,auVar101);
              uVar41 = *(undefined4 *)(uVar43 + 0x160 + lVar48);
              auVar114._4_4_ = uVar41;
              auVar114._0_4_ = uVar41;
              auVar114._8_4_ = uVar41;
              auVar114._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0xa0 + lVar48);
              auVar102._4_4_ = uVar41;
              auVar102._0_4_ = uVar41;
              auVar102._8_4_ = uVar41;
              auVar102._12_4_ = uVar41;
              auVar112 = vfmadd231ps_fma(auVar102,auVar79,auVar114);
              uVar41 = *(undefined4 *)(uVar43 + 0x1a0 + lVar48);
              auVar129._4_4_ = uVar41;
              auVar129._0_4_ = uVar41;
              auVar129._8_4_ = uVar41;
              auVar129._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0xe0 + lVar48);
              auVar115._4_4_ = uVar41;
              auVar115._0_4_ = uVar41;
              auVar115._8_4_ = uVar41;
              auVar115._12_4_ = uVar41;
              auVar113 = vfmadd231ps_fma(auVar115,auVar79,auVar129);
              uVar41 = *(undefined4 *)(uVar43 + 0x140 + lVar48);
              auVar137._4_4_ = uVar41;
              auVar137._0_4_ = uVar41;
              auVar137._8_4_ = uVar41;
              auVar137._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0x80 + lVar48);
              auVar130._4_4_ = uVar41;
              auVar130._0_4_ = uVar41;
              auVar130._8_4_ = uVar41;
              auVar130._12_4_ = uVar41;
              auVar127 = vfmadd231ps_fma(auVar130,auVar79,auVar137);
              uVar41 = *(undefined4 *)(uVar43 + 0x180 + lVar48);
              auVar138._4_4_ = uVar41;
              auVar138._0_4_ = uVar41;
              auVar138._8_4_ = uVar41;
              auVar138._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0xc0 + lVar48);
              auVar149._4_4_ = uVar41;
              auVar149._0_4_ = uVar41;
              auVar149._8_4_ = uVar41;
              auVar149._12_4_ = uVar41;
              auVar128 = vfmadd231ps_fma(auVar149,auVar79,auVar138);
              uVar41 = *(undefined4 *)(uVar43 + 0x1c0 + lVar48);
              auVar139._4_4_ = uVar41;
              auVar139._0_4_ = uVar41;
              auVar139._8_4_ = uVar41;
              auVar139._12_4_ = uVar41;
              uVar41 = *(undefined4 *)(uVar43 + 0x100 + lVar48);
              auVar159._4_4_ = uVar41;
              auVar159._0_4_ = uVar41;
              auVar159._8_4_ = uVar41;
              auVar159._12_4_ = uVar41;
              auVar165 = vfmadd231ps_fma(auVar159,auVar79,auVar139);
              auVar14._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar14._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar14._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar14._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar166 = vfmsub213ps_fma(auVar57,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar14);
              auVar15._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar15._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar15._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar15._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar58 = vfmsub213ps_fma(auVar112,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,auVar15);
              auVar16._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar16._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar16._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar16._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar59 = vfmsub213ps_fma(auVar113,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.z.field_0,auVar16);
              auVar113 = vfmsub213ps_fma(auVar127,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
              auVar127 = vfmsub213ps_fma(auVar128,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
              auVar128 = vfmsub213ps_fma(auVar165,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
              auVar57 = vpminsd_avx(auVar166,auVar113);
              auVar112 = vpminsd_avx(auVar58,auVar127);
              auVar57 = vpmaxsd_avx(auVar57,auVar112);
              auVar112 = vpminsd_avx(auVar59,auVar128);
              auVar57 = vpmaxsd_avx(auVar57,auVar112);
              auVar112 = vpmaxsd_avx(auVar166,auVar113);
              auVar113 = vpmaxsd_avx(auVar58,auVar127);
              auVar127 = vpminsd_avx(auVar112,auVar113);
              auVar112 = vpmaxsd_avx(auVar59,auVar128);
              auVar113 = vpmaxsd_avx(auVar57,(undefined1  [16])tray.tnear.field_0);
              auVar112 = vpminsd_avx(auVar127,auVar112);
              auVar112 = vpminsd_avx(auVar112,(undefined1  [16])tray.tfar.field_0);
              if (((uint)root.ptr & 7) == 6) {
                auVar112 = vcmpps_avx(auVar113,auVar112,2);
                uVar41 = *(undefined4 *)(uVar43 + 0x1e0 + lVar48);
                auVar103._4_4_ = uVar41;
                auVar103._0_4_ = uVar41;
                auVar103._8_4_ = uVar41;
                auVar103._12_4_ = uVar41;
                auVar113 = vcmpps_avx(auVar103,auVar79,2);
                uVar41 = *(undefined4 *)(uVar43 + 0x200 + lVar48);
                auVar116._4_4_ = uVar41;
                auVar116._0_4_ = uVar41;
                auVar116._8_4_ = uVar41;
                auVar116._12_4_ = uVar41;
                auVar79 = vcmpps_avx(auVar79,auVar116,1);
                auVar79 = vandps_avx(auVar113,auVar79);
                auVar79 = vandps_avx(auVar79,auVar112);
              }
              else {
                auVar79 = vcmpps_avx(auVar113,auVar112,2);
              }
              auVar79 = vandps_avx(auVar79,auVar99);
              auVar79 = vpslld_avx(auVar79,0x1f);
              if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar79[0xf]) {
                auVar87 = ZEXT1664(auVar65);
                sVar6 = sVar51;
              }
              else {
                auVar79 = vblendvps_avx(auVar186._0_16_,auVar57,auVar79);
                auVar87 = ZEXT1664(auVar79);
                if (sVar51 != 8) {
                  pNVar54->ptr = sVar51;
                  pNVar54 = pNVar54 + 1;
                  *(undefined1 (*) [16])paVar55->v = auVar65;
                  paVar55 = paVar55 + 1;
                }
              }
              sVar51 = sVar6;
              auVar65 = auVar87._0_16_;
            }
            if (sVar51 == 8) goto LAB_0164100a;
            auVar99 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar65,6);
            uVar41 = vmovmskps_avx(auVar99);
            root.ptr = sVar51;
          } while ((byte)uVar47 < (byte)POPCOUNT(uVar41));
          pNVar54->ptr = sVar51;
          pNVar54 = pNVar54 + 1;
          *(undefined1 (*) [16])paVar55->v = auVar65;
          paVar55 = paVar55 + 1;
LAB_0164100a:
          iVar42 = 4;
        }
        else {
          while (uVar43 != 0) {
            sVar51 = 0;
            for (uVar46 = uVar43; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              sVar51 = sVar51 + 1;
            }
            uVar43 = uVar43 - 1 & uVar43;
            auVar87 = ZEXT1664(auVar87._0_16_);
            bVar39 = occluded1(This,bvh,root,sVar51,&pre,ray,&tray,context);
            if (bVar39) {
              terminated.field_0.i[sVar51] = -1;
            }
          }
          auVar99 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar42 = 3;
          auVar186 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar191 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar99[0xf] < '\0') {
            auVar87 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar99._8_4_ = 0xff800000;
            auVar99._0_8_ = 0xff800000ff800000;
            auVar99._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar99,
                               (undefined1  [16])terminated.field_0);
            iVar42 = 2;
          }
          if (uVar47 < uVar40) goto LAB_01640ddb;
        }
      } while (iVar42 != 3);
LAB_016423a3:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar86._8_4_ = 0xff800000;
      auVar86._0_8_ = 0xff800000ff800000;
      auVar86._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar86);
      *(undefined1 (*) [16])pRVar1 = auVar10;
    }
  }
  return;
LAB_01641079:
  do {
    auVar99 = auVar87._0_16_;
    if (lVar48 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar53 = lVar48 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    auVar87 = ZEXT1664(local_37a8);
    uVar41 = vmovmskps_avx(local_37a8);
    uVar43 = 0;
    uVar44 = CONCAT44((int)((ulong)lVar48 >> 0x20),uVar41);
    for (uVar46 = uVar44; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      uVar43 = uVar43 + 1;
    }
    lVar50 = 0;
    do {
      auVar65 = auVar87._0_16_;
      if ((lVar50 == 4) || (*(int *)(lVar53 + 0x50 + lVar50 * 4) == -1)) break;
      uVar40 = *(uint *)(lVar53 + 0x40 + lVar50 * 4);
      pGVar7 = (context->scene->geometries).items[uVar40].ptr;
      fVar56 = (pGVar7->time_range).lower;
      auVar57._4_4_ = fVar56;
      auVar57._0_4_ = fVar56;
      auVar57._8_4_ = fVar56;
      auVar57._12_4_ = fVar56;
      fVar76 = pGVar7->fnumTimeSegments;
      auVar99 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar57);
      fVar56 = (pGVar7->time_range).upper - fVar56;
      auVar58._4_4_ = fVar56;
      auVar58._0_4_ = fVar56;
      auVar58._8_4_ = fVar56;
      auVar58._12_4_ = fVar56;
      auVar99 = vdivps_avx(auVar99,auVar58);
      auVar59._0_4_ = fVar76 * auVar99._0_4_;
      auVar59._4_4_ = fVar76 * auVar99._4_4_;
      auVar59._8_4_ = fVar76 * auVar99._8_4_;
      auVar59._12_4_ = fVar76 * auVar99._12_4_;
      auVar99 = vroundps_avx(auVar59,1);
      fVar76 = fVar76 + -1.0;
      auVar89._4_4_ = fVar76;
      auVar89._0_4_ = fVar76;
      auVar89._8_4_ = fVar76;
      auVar89._12_4_ = fVar76;
      auVar99 = vminps_avx(auVar99,auVar89);
      auVar99 = vmaxps_avx(auVar99,_DAT_01f45a50);
      auVar79 = vsubps_avx(auVar59,auVar99);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar99);
      iVar42 = itime.field_0.i[uVar43];
      auVar90._4_4_ = iVar42;
      auVar90._0_4_ = iVar42;
      auVar90._8_4_ = iVar42;
      auVar90._12_4_ = iVar42;
      auVar99 = vpcmpeqd_avx(auVar90,(undefined1  [16])itime.field_0);
      auVar99 = local_37a8 & ~auVar99;
      fVar76 = auVar79._4_4_;
      fVar77 = auVar79._8_4_;
      fVar78 = auVar79._12_4_;
      fVar56 = auVar79._0_4_;
      uVar45 = uVar44;
      uVar46 = uVar43;
      if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar99[0xf])
      {
        lVar49 = *(long *)(*(long *)&pGVar7[2].numPrimitives + (long)iVar42 * 0x38);
        lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + (long)iVar42 * 0x38);
        uVar46 = (ulong)*(uint *)(lVar53 + lVar50 * 4);
        uVar45 = (ulong)*(uint *)(lVar53 + 0x10 + lVar50 * 4);
        uVar41 = *(undefined4 *)(lVar49 + uVar46 * 4);
        auVar131._4_4_ = uVar41;
        auVar131._0_4_ = uVar41;
        auVar131._8_4_ = uVar41;
        auVar131._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 4 + uVar46 * 4);
        auVar140._4_4_ = uVar41;
        auVar140._0_4_ = uVar41;
        auVar140._8_4_ = uVar41;
        auVar140._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 8 + uVar46 * 4);
        auVar150._4_4_ = uVar41;
        auVar150._0_4_ = uVar41;
        auVar150._8_4_ = uVar41;
        auVar150._12_4_ = uVar41;
        fVar100 = *(float *)(lVar8 + uVar46 * 4);
        fVar108 = *(float *)(lVar8 + 4 + uVar46 * 4);
        fVar109 = *(float *)(lVar8 + 8 + uVar46 * 4);
        auVar91._8_4_ = 0x3f800000;
        auVar91._0_8_ = 0x3f8000003f800000;
        auVar91._12_4_ = 0x3f800000;
        auVar99 = vsubps_avx(auVar91,auVar79);
        auVar187._0_4_ = fVar56 * fVar100;
        auVar187._4_4_ = fVar76 * fVar100;
        auVar187._8_4_ = fVar77 * fVar100;
        auVar187._12_4_ = fVar78 * fVar100;
        auVar80._0_4_ = fVar56 * fVar108;
        auVar80._4_4_ = fVar76 * fVar108;
        auVar80._8_4_ = fVar77 * fVar108;
        auVar80._12_4_ = fVar78 * fVar108;
        auVar117._0_4_ = fVar109 * fVar56;
        auVar117._4_4_ = fVar109 * fVar76;
        auVar117._8_4_ = fVar109 * fVar77;
        auVar117._12_4_ = fVar109 * fVar78;
        auVar190 = vfmadd231ps_fma(auVar187,auVar99,auVar131);
        auVar84 = vfmadd231ps_fma(auVar80,auVar99,auVar140);
        auVar120 = vfmadd231ps_fma(auVar117,auVar99,auVar150);
        uVar41 = *(undefined4 *)(lVar49 + uVar45 * 4);
        auVar132._4_4_ = uVar41;
        auVar132._0_4_ = uVar41;
        auVar132._8_4_ = uVar41;
        auVar132._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 4 + uVar45 * 4);
        auVar141._4_4_ = uVar41;
        auVar141._0_4_ = uVar41;
        auVar141._8_4_ = uVar41;
        auVar141._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 8 + uVar45 * 4);
        auVar151._4_4_ = uVar41;
        auVar151._0_4_ = uVar41;
        auVar151._8_4_ = uVar41;
        auVar151._12_4_ = uVar41;
        fVar100 = *(float *)(lVar8 + uVar45 * 4);
        fVar108 = *(float *)(lVar8 + 4 + uVar45 * 4);
        fVar109 = *(float *)(lVar8 + 8 + uVar45 * 4);
        auVar179._0_4_ = fVar100 * fVar56;
        auVar179._4_4_ = fVar100 * fVar76;
        auVar179._8_4_ = fVar100 * fVar77;
        auVar179._12_4_ = fVar100 * fVar78;
        auVar182._0_4_ = fVar108 * fVar56;
        auVar182._4_4_ = fVar108 * fVar76;
        auVar182._8_4_ = fVar108 * fVar77;
        auVar182._12_4_ = fVar108 * fVar78;
        auVar169._0_4_ = fVar109 * fVar56;
        auVar169._4_4_ = fVar109 * fVar76;
        auVar169._8_4_ = fVar109 * fVar77;
        auVar169._12_4_ = fVar109 * fVar78;
        auVar181 = vfmadd231ps_fma(auVar179,auVar99,auVar132);
        auVar185 = vfmadd231ps_fma(auVar182,auVar99,auVar141);
        auVar154 = vfmadd231ps_fma(auVar169,auVar99,auVar151);
        uVar46 = (ulong)*(uint *)(lVar53 + 0x20 + lVar50 * 4);
        uVar41 = *(undefined4 *)(lVar49 + uVar46 * 4);
        auVar133._4_4_ = uVar41;
        auVar133._0_4_ = uVar41;
        auVar133._8_4_ = uVar41;
        auVar133._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 4 + uVar46 * 4);
        auVar142._4_4_ = uVar41;
        auVar142._0_4_ = uVar41;
        auVar142._8_4_ = uVar41;
        auVar142._12_4_ = uVar41;
        uVar41 = *(undefined4 *)(lVar49 + 8 + uVar46 * 4);
        auVar152._4_4_ = uVar41;
        auVar152._0_4_ = uVar41;
        auVar152._8_4_ = uVar41;
        auVar152._12_4_ = uVar41;
        fVar100 = *(float *)(lVar8 + uVar46 * 4);
        fVar108 = *(float *)(lVar8 + 4 + uVar46 * 4);
        fVar109 = *(float *)(lVar8 + 8 + uVar46 * 4);
        auVar177._0_4_ = fVar100 * fVar56;
        auVar177._4_4_ = fVar100 * fVar76;
        auVar177._8_4_ = fVar100 * fVar77;
        auVar177._12_4_ = fVar100 * fVar78;
        auVar160._0_4_ = fVar108 * fVar56;
        auVar160._4_4_ = fVar108 * fVar76;
        auVar160._8_4_ = fVar108 * fVar77;
        auVar160._12_4_ = fVar108 * fVar78;
        auVar162._0_4_ = fVar109 * fVar56;
        auVar162._4_4_ = fVar109 * fVar76;
        auVar162._8_4_ = fVar109 * fVar77;
        auVar162._12_4_ = fVar109 * fVar78;
        _local_3668 = vfmadd231ps_fma(auVar177,auVar99,auVar133);
        _local_3848 = vfmadd231ps_fma(auVar160,auVar99,auVar142);
        _local_3768 = vfmadd231ps_fma(auVar162,auVar99,auVar152);
        uVar46 = (ulong)*(uint *)(lVar53 + 0x30 + lVar50 * 4);
        fVar100 = *(float *)(lVar8 + uVar46 * 4);
        fVar108 = *(float *)(lVar8 + 4 + uVar46 * 4);
        fVar109 = *(float *)(lVar8 + 8 + uVar46 * 4);
        auVar134._0_4_ = fVar56 * fVar100;
        auVar134._4_4_ = fVar76 * fVar100;
        auVar134._8_4_ = fVar77 * fVar100;
        auVar134._12_4_ = fVar78 * fVar100;
        auVar143._0_4_ = fVar56 * fVar108;
        auVar143._4_4_ = fVar76 * fVar108;
        auVar143._8_4_ = fVar77 * fVar108;
        auVar143._12_4_ = fVar78 * fVar108;
        auVar163._0_4_ = fVar56 * fVar109;
        auVar163._4_4_ = fVar76 * fVar109;
        auVar163._8_4_ = fVar77 * fVar109;
        auVar163._12_4_ = fVar78 * fVar109;
        uVar41 = *(undefined4 *)(lVar49 + uVar46 * 4);
        auVar60._4_4_ = uVar41;
        auVar60._0_4_ = uVar41;
        auVar60._8_4_ = uVar41;
        auVar60._12_4_ = uVar41;
        auVar145 = vfmadd231ps_fma(auVar134,auVar99,auVar60);
        uVar41 = *(undefined4 *)(lVar49 + 4 + uVar46 * 4);
        auVar61._4_4_ = uVar41;
        auVar61._0_4_ = uVar41;
        auVar61._8_4_ = uVar41;
        auVar61._12_4_ = uVar41;
        auVar155 = vfmadd231ps_fma(auVar143,auVar99,auVar61);
        uVar41 = *(undefined4 *)(lVar49 + 8 + uVar46 * 4);
        auVar62._4_4_ = uVar41;
        auVar62._0_4_ = uVar41;
        auVar62._8_4_ = uVar41;
        auVar62._12_4_ = uVar41;
        auVar164 = vfmadd231ps_fma(auVar163,auVar99,auVar62);
      }
      else {
        while (uVar45 != 0) {
          lVar49 = (long)itime.field_0.i[uVar46] * 0x38;
          uVar52 = (ulong)*(uint *)(lVar53 + lVar50 * 4);
          auVar99 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar52 * 4);
          auVar57 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar52 * 4);
          *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar99._0_4_;
          uVar41 = vextractps_avx(auVar99,1);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar41;
          uVar41 = vextractps_avx(auVar99,2);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar41;
          *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar57._0_4_;
          uVar41 = vextractps_avx(auVar57,1);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar41;
          uVar41 = vextractps_avx(auVar57,2);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar41;
          uVar52 = uVar46 & 0x3f;
          uVar46 = 0;
          uVar45 = uVar45 ^ 1L << uVar52;
          for (uVar52 = uVar45; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
            uVar46 = uVar46 + 1;
          }
        }
        auVar83._8_4_ = 0x3f800000;
        auVar83._0_8_ = 0x3f8000003f800000;
        auVar83._12_4_ = 0x3f800000;
        auVar99 = vsubps_avx(auVar83,auVar79);
        uVar24 = p0.field_0._0_4_;
        uVar25 = p0.field_0._4_4_;
        uVar26 = p0.field_0._8_4_;
        uVar27 = p0.field_0._12_4_;
        uVar28 = p0.field_0._32_4_;
        uVar29 = p0.field_0._36_4_;
        uVar32 = p0.field_0._40_4_;
        uVar35 = p0.field_0._44_4_;
        fVar100 = auVar99._0_4_;
        fVar108 = auVar99._4_4_;
        fVar109 = auVar99._8_4_;
        fVar110 = auVar99._12_4_;
        uVar41 = p1.field_0._0_4_;
        uVar21 = p1.field_0._4_4_;
        uVar22 = p1.field_0._8_4_;
        uVar23 = p1.field_0._12_4_;
        auVar84._0_4_ = fVar100 * (float)p0.field_0._16_4_ + fVar56 * (float)p1.field_0._16_4_;
        auVar84._4_4_ = fVar108 * (float)p0.field_0._20_4_ + fVar76 * (float)p1.field_0._20_4_;
        auVar84._8_4_ = fVar109 * (float)p0.field_0._24_4_ + fVar77 * (float)p1.field_0._24_4_;
        auVar84._12_4_ = fVar110 * (float)p0.field_0._28_4_ + fVar78 * (float)p1.field_0._28_4_;
        fVar111 = fVar56 * (float)p1.field_0._32_4_;
        fVar124 = fVar76 * (float)p1.field_0._36_4_;
        fVar125 = fVar77 * (float)p1.field_0._40_4_;
        fVar126 = fVar78 * (float)p1.field_0._44_4_;
        uVar45 = uVar44;
        uVar46 = uVar43;
        while (uVar45 != 0) {
          lVar49 = (long)itime.field_0.i[uVar46] * 0x38;
          uVar52 = (ulong)*(uint *)(lVar53 + 0x10 + lVar50 * 4);
          auVar99 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar52 * 4);
          auVar79 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar52 * 4);
          *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar99._0_4_;
          uVar3 = vextractps_avx(auVar99,1);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar99,2);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar79._0_4_;
          uVar3 = vextractps_avx(auVar79,1);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar79,2);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar3;
          uVar52 = uVar46 & 0x3f;
          uVar46 = 0;
          uVar45 = uVar45 ^ 1L << uVar52;
          for (uVar52 = uVar45; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
            uVar46 = uVar46 + 1;
          }
        }
        auVar190._0_4_ = fVar100 * (float)uVar24 + fVar56 * (float)uVar41;
        auVar190._4_4_ = fVar108 * (float)uVar25 + fVar76 * (float)uVar21;
        auVar190._8_4_ = fVar109 * (float)uVar26 + fVar77 * (float)uVar22;
        auVar190._12_4_ = fVar110 * (float)uVar27 + fVar78 * (float)uVar23;
        uVar24 = p0.field_0._0_4_;
        uVar25 = p0.field_0._4_4_;
        uVar26 = p0.field_0._8_4_;
        uVar27 = p0.field_0._12_4_;
        uVar3 = p0.field_0._32_4_;
        uVar30 = p0.field_0._36_4_;
        uVar33 = p0.field_0._40_4_;
        uVar36 = p0.field_0._44_4_;
        uVar41 = p1.field_0._0_4_;
        uVar21 = p1.field_0._4_4_;
        uVar22 = p1.field_0._8_4_;
        uVar23 = p1.field_0._12_4_;
        auVar185._0_4_ = fVar56 * (float)p1.field_0._16_4_ + fVar100 * (float)p0.field_0._16_4_;
        auVar185._4_4_ = fVar76 * (float)p1.field_0._20_4_ + fVar108 * (float)p0.field_0._20_4_;
        auVar185._8_4_ = fVar77 * (float)p1.field_0._24_4_ + fVar109 * (float)p0.field_0._24_4_;
        auVar185._12_4_ = fVar78 * (float)p1.field_0._28_4_ + fVar110 * (float)p0.field_0._28_4_;
        fVar148 = fVar56 * (float)p1.field_0._32_4_;
        fVar156 = fVar76 * (float)p1.field_0._36_4_;
        fVar157 = fVar77 * (float)p1.field_0._40_4_;
        fVar158 = fVar78 * (float)p1.field_0._44_4_;
        uVar45 = uVar44;
        uVar46 = uVar43;
        while (uVar45 != 0) {
          lVar49 = (long)itime.field_0.i[uVar46] * 0x38;
          uVar52 = (ulong)*(uint *)(lVar53 + 0x20 + lVar50 * 4);
          auVar99 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar52 * 4);
          auVar79 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar52 * 4);
          *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar99._0_4_;
          uVar4 = vextractps_avx(auVar99,1);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar99,2);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar4;
          *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar79._0_4_;
          uVar4 = vextractps_avx(auVar79,1);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar79,2);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar4;
          uVar52 = uVar46 & 0x3f;
          uVar46 = 0;
          uVar45 = uVar45 ^ 1L << uVar52;
          for (uVar52 = uVar45; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
            uVar46 = uVar46 + 1;
          }
        }
        auVar181._0_4_ = (float)uVar24 * fVar100 + (float)uVar41 * fVar56;
        auVar181._4_4_ = (float)uVar25 * fVar108 + (float)uVar21 * fVar76;
        auVar181._8_4_ = (float)uVar26 * fVar109 + (float)uVar22 * fVar77;
        auVar181._12_4_ = (float)uVar27 * fVar110 + (float)uVar23 * fVar78;
        uVar24 = p0.field_0._0_4_;
        uVar25 = p0.field_0._4_4_;
        uVar26 = p0.field_0._8_4_;
        uVar27 = p0.field_0._12_4_;
        uVar4 = p0.field_0._32_4_;
        uVar31 = p0.field_0._36_4_;
        uVar34 = p0.field_0._40_4_;
        uVar37 = p0.field_0._44_4_;
        uVar41 = p1.field_0._0_4_;
        uVar21 = p1.field_0._4_4_;
        uVar22 = p1.field_0._8_4_;
        uVar23 = p1.field_0._12_4_;
        local_3848._4_4_ = fVar108 * (float)p0.field_0._20_4_ + fVar76 * (float)p1.field_0._20_4_;
        local_3848._0_4_ = fVar100 * (float)p0.field_0._16_4_ + fVar56 * (float)p1.field_0._16_4_;
        fStack_3840 = fVar109 * (float)p0.field_0._24_4_ + fVar77 * (float)p1.field_0._24_4_;
        fStack_383c = fVar110 * (float)p0.field_0._28_4_ + fVar78 * (float)p1.field_0._28_4_;
        fVar168 = fVar56 * (float)p1.field_0._32_4_;
        fVar171 = fVar76 * (float)p1.field_0._36_4_;
        fVar173 = fVar77 * (float)p1.field_0._40_4_;
        fVar175 = fVar78 * (float)p1.field_0._44_4_;
        uVar45 = uVar44;
        uVar46 = uVar43;
        while (uVar45 != 0) {
          lVar49 = (long)itime.field_0.i[uVar46] * 0x38;
          uVar52 = (ulong)*(uint *)(lVar53 + 0x30 + lVar50 * 4);
          auVar99 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar52 * 4);
          auVar79 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar52 * 4);
          *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar99._0_4_;
          uVar5 = vextractps_avx(auVar99,1);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar99,2);
          *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar5;
          *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar79._0_4_;
          uVar5 = vextractps_avx(auVar79,1);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar79,2);
          *(undefined4 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar5;
          uVar52 = uVar46 & 0x3f;
          uVar46 = 0;
          uVar45 = uVar45 ^ 1L << uVar52;
          for (uVar52 = uVar45; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
            uVar46 = uVar46 + 1;
          }
        }
        auVar120._0_4_ = fVar100 * (float)uVar28 + fVar111;
        auVar120._4_4_ = fVar108 * (float)uVar29 + fVar124;
        auVar120._8_4_ = fVar109 * (float)uVar32 + fVar125;
        auVar120._12_4_ = fVar110 * (float)uVar35 + fVar126;
        auVar154._0_4_ = fVar100 * (float)uVar3 + fVar148;
        auVar154._4_4_ = fVar108 * (float)uVar30 + fVar156;
        auVar154._8_4_ = fVar109 * (float)uVar33 + fVar157;
        auVar154._12_4_ = fVar110 * (float)uVar36 + fVar158;
        local_3768._4_4_ = fVar171 + (float)uVar31 * fVar108;
        local_3768._0_4_ = fVar168 + (float)uVar4 * fVar100;
        fStack_3760 = fVar173 + (float)uVar34 * fVar109;
        fStack_375c = fVar175 + (float)uVar37 * fVar110;
        local_3668._4_4_ = (float)uVar25 * fVar108 + (float)uVar21 * fVar76;
        local_3668._0_4_ = (float)uVar24 * fVar100 + (float)uVar41 * fVar56;
        fStack_3660 = (float)uVar26 * fVar109 + (float)uVar22 * fVar77;
        fStack_365c = (float)uVar27 * fVar110 + (float)uVar23 * fVar78;
        auVar145._0_4_ = fVar56 * (float)p1.field_0._0_4_ + fVar100 * (float)p0.field_0._0_4_;
        auVar145._4_4_ = fVar76 * (float)p1.field_0._4_4_ + fVar108 * (float)p0.field_0._4_4_;
        auVar145._8_4_ = fVar77 * (float)p1.field_0._8_4_ + fVar109 * (float)p0.field_0._8_4_;
        auVar145._12_4_ = fVar78 * (float)p1.field_0._12_4_ + fVar110 * (float)p0.field_0._12_4_;
        auVar155._0_4_ = fVar100 * (float)p0.field_0._16_4_ + fVar56 * (float)p1.field_0._16_4_;
        auVar155._4_4_ = fVar108 * (float)p0.field_0._20_4_ + fVar76 * (float)p1.field_0._20_4_;
        auVar155._8_4_ = fVar109 * (float)p0.field_0._24_4_ + fVar77 * (float)p1.field_0._24_4_;
        auVar155._12_4_ = fVar110 * (float)p0.field_0._28_4_ + fVar78 * (float)p1.field_0._28_4_;
        auVar164._0_4_ = fVar100 * (float)p0.field_0._32_4_ + fVar56 * (float)p1.field_0._32_4_;
        auVar164._4_4_ = fVar108 * (float)p0.field_0._36_4_ + fVar76 * (float)p1.field_0._36_4_;
        auVar164._8_4_ = fVar109 * (float)p0.field_0._40_4_ + fVar77 * (float)p1.field_0._40_4_;
        auVar164._12_4_ = fVar110 * (float)p0.field_0._44_4_ + fVar78 * (float)p1.field_0._44_4_;
      }
      auVar112 = vsubps_avx(auVar190,auVar181);
      auVar113 = vsubps_avx(auVar84,auVar185);
      auVar127 = vsubps_avx(auVar120,auVar154);
      auVar128 = vsubps_avx(auVar145,auVar190);
      auVar165 = vsubps_avx(auVar155,auVar84);
      auVar166 = vsubps_avx(auVar164,auVar120);
      auVar135._0_4_ = auVar166._0_4_ * auVar113._0_4_;
      auVar135._4_4_ = auVar166._4_4_ * auVar113._4_4_;
      auVar135._8_4_ = auVar166._8_4_ * auVar113._8_4_;
      auVar135._12_4_ = auVar166._12_4_ * auVar113._12_4_;
      vVar11.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmsub231ps_fma(auVar135,auVar165,auVar127);
      auVar92._0_4_ = auVar127._0_4_ * auVar128._0_4_;
      auVar92._4_4_ = auVar127._4_4_ * auVar128._4_4_;
      auVar92._8_4_ = auVar127._8_4_ * auVar128._8_4_;
      auVar92._12_4_ = auVar127._12_4_ * auVar128._12_4_;
      auVar83 = vfmsub231ps_fma(auVar92,auVar166,auVar112);
      auVar144._0_4_ = auVar165._0_4_ * auVar112._0_4_;
      auVar144._4_4_ = auVar165._4_4_ * auVar112._4_4_;
      auVar144._8_4_ = auVar165._8_4_ * auVar112._8_4_;
      auVar144._12_4_ = auVar165._12_4_ * auVar112._12_4_;
      auVar58 = vsubps_avx(auVar190,*(undefined1 (*) [16])ray);
      auVar59 = vsubps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x10));
      auVar84 = vfmsub231ps_fma(auVar144,auVar128,auVar113);
      auVar89 = vsubps_avx(auVar120,*(undefined1 (*) [16])(ray + 0x20));
      auVar99 = *(undefined1 (*) [16])(ray + 0x40);
      auVar79 = *(undefined1 (*) [16])(ray + 0x50);
      auVar57 = *(undefined1 (*) [16])(ray + 0x60);
      auVar183._0_4_ = auVar59._0_4_ * auVar99._0_4_;
      auVar183._4_4_ = auVar59._4_4_ * auVar99._4_4_;
      auVar183._8_4_ = auVar59._8_4_ * auVar99._8_4_;
      auVar183._12_4_ = auVar59._12_4_ * auVar99._12_4_;
      auVar190 = vfmsub231ps_fma(auVar183,auVar58,auVar79);
      auVar118._0_4_ = auVar84._0_4_ * auVar57._0_4_;
      auVar118._4_4_ = auVar84._4_4_ * auVar57._4_4_;
      auVar118._8_4_ = auVar84._8_4_ * auVar57._8_4_;
      auVar118._12_4_ = auVar84._12_4_ * auVar57._12_4_;
      auVar90 = vfmadd231ps_fma(auVar118,auVar83,auVar79);
      auVar188._0_4_ = auVar89._0_4_ * auVar79._0_4_;
      auVar188._4_4_ = auVar89._4_4_ * auVar79._4_4_;
      auVar188._8_4_ = auVar89._8_4_ * auVar79._8_4_;
      auVar188._12_4_ = auVar89._12_4_ * auVar79._12_4_;
      auVar120 = vfmsub231ps_fma(auVar188,auVar59,auVar57);
      auVar81._0_4_ = auVar57._0_4_ * auVar58._0_4_;
      auVar81._4_4_ = auVar57._4_4_ * auVar58._4_4_;
      auVar81._8_4_ = auVar57._8_4_ * auVar58._8_4_;
      auVar81._12_4_ = auVar57._12_4_ * auVar58._12_4_;
      auVar60 = vfmsub231ps_fma(auVar81,auVar89,auVar99);
      auVar57 = vfmadd231ps_fma(auVar90,(undefined1  [16])vVar11.field_0,auVar99);
      auVar63._0_4_ = auVar166._0_4_ * auVar190._0_4_;
      auVar63._4_4_ = auVar166._4_4_ * auVar190._4_4_;
      auVar63._8_4_ = auVar166._8_4_ * auVar190._8_4_;
      auVar63._12_4_ = auVar166._12_4_ * auVar190._12_4_;
      auVar99 = vfmadd231ps_fma(auVar63,auVar60,auVar165);
      auVar104._8_4_ = 0x80000000;
      auVar104._0_8_ = 0x8000000080000000;
      auVar104._12_4_ = 0x80000000;
      auVar79 = vfmadd231ps_fma(auVar99,auVar120,auVar128);
      auVar99 = vandps_avx(auVar57,auVar104);
      uVar167 = auVar99._0_4_;
      auVar178._0_4_ = (float)(uVar167 ^ auVar79._0_4_);
      uVar170 = auVar99._4_4_;
      auVar178._4_4_ = (float)(uVar170 ^ auVar79._4_4_);
      uVar172 = auVar99._8_4_;
      auVar178._8_4_ = (float)(uVar172 ^ auVar79._8_4_);
      uVar174 = auVar99._12_4_;
      auVar178._12_4_ = (float)(uVar174 ^ auVar79._12_4_);
      auVar99 = vcmpps_avx(auVar178,_DAT_01f45a50,5);
      auVar79 = auVar65 & auVar99;
      if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar79[0xf] < '\0'
         ) {
        auVar99 = vandps_avx(auVar99,auVar65);
        auVar66._0_4_ = auVar127._0_4_ * auVar190._0_4_;
        auVar66._4_4_ = auVar127._4_4_ * auVar190._4_4_;
        auVar66._8_4_ = auVar127._8_4_ * auVar190._8_4_;
        auVar66._12_4_ = auVar127._12_4_ * auVar190._12_4_;
        auVar79 = vfmadd213ps_fma(auVar113,auVar60,auVar66);
        auVar79 = vfmadd213ps_fma(auVar112,auVar120,auVar79);
        auVar153._0_4_ = (float)(uVar167 ^ auVar79._0_4_);
        auVar153._4_4_ = (float)(uVar170 ^ auVar79._4_4_);
        auVar153._8_4_ = (float)(uVar172 ^ auVar79._8_4_);
        auVar153._12_4_ = (float)(uVar174 ^ auVar79._12_4_);
        auVar79 = vcmpps_avx(auVar153,_DAT_01f45a50,5);
        auVar112 = auVar99 & auVar79;
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          auVar112 = vandps_avx(auVar57,auVar176);
          auVar99 = vandps_avx(auVar99,auVar79);
          auVar79 = vsubps_avx(auVar112,auVar178);
          auVar79 = vcmpps_avx(auVar79,auVar153,5);
          auVar113 = auVar99 & auVar79;
          if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar113[0xf] < '\0') {
            auVar99 = vandps_avx(auVar79,auVar99);
            auVar71._0_4_ = auVar89._0_4_ * auVar84._0_4_;
            auVar71._4_4_ = auVar89._4_4_ * auVar84._4_4_;
            auVar71._8_4_ = auVar89._8_4_ * auVar84._8_4_;
            auVar71._12_4_ = auVar89._12_4_ * auVar84._12_4_;
            auVar79 = vfmadd132ps_fma(auVar59,auVar71,auVar83);
            auVar79 = vfmadd132ps_fma(auVar58,auVar79,(undefined1  [16])vVar11.field_0);
            auVar94._0_4_ = uVar167 ^ auVar79._0_4_;
            auVar94._4_4_ = uVar170 ^ auVar79._4_4_;
            auVar94._8_4_ = uVar172 ^ auVar79._8_4_;
            auVar94._12_4_ = uVar174 ^ auVar79._12_4_;
            auVar72._0_4_ = auVar112._0_4_ * *(float *)(ray + 0x30);
            auVar72._4_4_ = auVar112._4_4_ * *(float *)(ray + 0x34);
            auVar72._8_4_ = auVar112._8_4_ * *(float *)(ray + 0x38);
            auVar72._12_4_ = auVar112._12_4_ * *(float *)(ray + 0x3c);
            auVar106._0_4_ = auVar112._0_4_ * *(float *)(ray + 0x80);
            auVar106._4_4_ = auVar112._4_4_ * *(float *)(ray + 0x84);
            auVar106._8_4_ = auVar112._8_4_ * *(float *)(ray + 0x88);
            auVar106._12_4_ = auVar112._12_4_ * *(float *)(ray + 0x8c);
            auVar79 = vcmpps_avx(auVar72,auVar94,1);
            auVar113 = vcmpps_avx(auVar94,auVar106,2);
            auVar79 = vandps_avx(auVar113,auVar79);
            auVar113 = auVar99 & auVar79;
            if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar113[0xf] < '\0') {
              auVar99 = vandps_avx(auVar79,auVar99);
              auVar79 = vcmpps_avx(auVar57,_DAT_01f45a50,4);
              auVar57 = auVar99 & auVar79;
              if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar57[0xf] < '\0') {
                auVar99 = vandps_avx(auVar79,auVar99);
                uVar167 = pGVar7->mask;
                auVar73._4_4_ = uVar167;
                auVar73._0_4_ = uVar167;
                auVar73._8_4_ = uVar167;
                auVar73._12_4_ = uVar167;
                auVar79 = vpand_avx(auVar73,*(undefined1 (*) [16])(ray + 0x90));
                auVar79 = vpcmpeqd_avx(auVar79,_DAT_01f45a50);
                auVar57 = auVar99 & ~auVar79;
                if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar57[0xf] < '\0') {
                  local_3888 = vandnps_avx(auVar79,auVar99);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar99 = vrcpps_avx(auVar112);
                    auVar123._8_4_ = 0x3f800000;
                    auVar123._0_8_ = 0x3f8000003f800000;
                    auVar123._12_4_ = 0x3f800000;
                    auVar79 = vfnmadd213ps_fma(auVar112,auVar99,auVar123);
                    auVar79 = vfmadd132ps_fma(auVar79,auVar99,auVar99);
                    auVar85._0_4_ = auVar178._0_4_ * auVar79._0_4_;
                    auVar85._4_4_ = auVar178._4_4_ * auVar79._4_4_;
                    auVar85._8_4_ = auVar178._8_4_ * auVar79._8_4_;
                    auVar85._12_4_ = auVar178._12_4_ * auVar79._12_4_;
                    auVar99 = vminps_avx(auVar85,auVar123);
                    auVar96._0_4_ = auVar79._0_4_ * auVar153._0_4_;
                    auVar96._4_4_ = auVar79._4_4_ * auVar153._4_4_;
                    auVar96._8_4_ = auVar79._8_4_ * auVar153._8_4_;
                    auVar96._12_4_ = auVar79._12_4_ * auVar153._12_4_;
                    auVar79 = vminps_avx(auVar96,auVar123);
                    auVar57 = vsubps_avx(auVar123,auVar99);
                    auVar112 = vsubps_avx(auVar123,auVar79);
                    auVar13._8_8_ = uVar18;
                    auVar13._0_8_ = uVar17;
                    vblendvps_avx(auVar99,auVar57,auVar13);
                    vblendvps_avx(auVar79,auVar112,auVar13);
                    local_3698 = auVar83._0_8_;
                    uStack_3690 = auVar83._8_8_;
                    p0.field_0._16_8_ = local_3698;
                    p0.field_0._24_8_ = uStack_3690;
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v_2;
                    p1.field_0._24_8_ = &u;
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar11.field_0;
                    p0.field_0._32_16_ = auVar84;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                    p0.field_0._16_8_ = local_3718;
                    p0.field_0._24_8_ = uStack_3710;
                    p0.field_0._40_8_ = uStack_3700;
                    p0.field_0._32_8_ = uStack_3708;
                    auVar75 = ZEXT1632(CONCAT412(uVar40,CONCAT48(uVar40,CONCAT44(uVar40,uVar40))));
                    vpcmpeqd_avx2(auVar75,auVar75);
                    auVar99 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar79 = vblendvps_avx(auVar99,(undefined1  [16])t.field_0,local_3888);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar79;
                    p1.field_0._0_8_ = local_3858;
                    p1.field_0._8_8_ = pGVar7->userPtr;
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p1.field_0._24_8_ = ray;
                    local_3858 = local_3888;
                    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                    }
                    if (local_3858 == (undefined1  [16])0x0) {
                      auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar79 = auVar79 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)((RTCFilterFunctionNArguments *)&p1);
                      }
                      auVar57 = vpcmpeqd_avx(local_3858,_DAT_01f45a50);
                      auVar79 = auVar57 ^ _DAT_01f46b70;
                      auVar97._8_4_ = 0xff800000;
                      auVar97._0_8_ = 0xff800000ff800000;
                      auVar97._12_4_ = 0xff800000;
                      auVar57 = vblendvps_avx(auVar97,*(undefined1 (*) [16])
                                                       (p1.field_0._24_8_ + 0x80),auVar57);
                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar57;
                    }
                    auVar79 = vpslld_avx(auVar79,0x1f);
                    local_3888 = vpsrad_avx(auVar79,0x1f);
                    auVar99 = vblendvps_avx(auVar99,*(undefined1 (*) [16])pRVar1,auVar79);
                    *(undefined1 (*) [16])pRVar1 = auVar99;
                  }
                  auVar65 = vandnps_avx(local_3888,auVar65);
                }
              }
            }
          }
        }
      }
      if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar65 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar65[0xf])
      {
        auVar186 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar112 = vsubps_avx(_local_3668,auVar145);
      auVar113 = vsubps_avx(_local_3848,auVar155);
      auVar127 = vsubps_avx(_local_3768,auVar164);
      auVar128 = vsubps_avx(auVar181,_local_3668);
      auVar165 = vsubps_avx(auVar185,_local_3848);
      auVar166 = vsubps_avx(auVar154,_local_3768);
      auVar93._0_4_ = auVar166._0_4_ * auVar113._0_4_;
      auVar93._4_4_ = auVar166._4_4_ * auVar113._4_4_;
      auVar93._8_4_ = auVar166._8_4_ * auVar113._8_4_;
      auVar93._12_4_ = auVar166._12_4_ * auVar113._12_4_;
      vVar11.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmsub231ps_fma(auVar93,auVar165,auVar127)
      ;
      auVar82._0_4_ = auVar127._0_4_ * auVar128._0_4_;
      auVar82._4_4_ = auVar127._4_4_ * auVar128._4_4_;
      auVar82._8_4_ = auVar127._8_4_ * auVar128._8_4_;
      auVar82._12_4_ = auVar127._12_4_ * auVar128._12_4_;
      auVar84 = vfmsub231ps_fma(auVar82,auVar166,auVar112);
      auVar119._0_4_ = auVar165._0_4_ * auVar112._0_4_;
      auVar119._4_4_ = auVar165._4_4_ * auVar112._4_4_;
      auVar119._8_4_ = auVar165._8_4_ * auVar112._8_4_;
      auVar119._12_4_ = auVar165._12_4_ * auVar112._12_4_;
      auVar58 = vsubps_avx(_local_3668,*(undefined1 (*) [16])ray);
      auVar59 = vsubps_avx(_local_3848,*(undefined1 (*) [16])(ray + 0x10));
      auVar89 = vsubps_avx(_local_3768,*(undefined1 (*) [16])(ray + 0x20));
      auVar83 = vfmsub231ps_fma(auVar119,auVar128,auVar113);
      auVar99 = *(undefined1 (*) [16])(ray + 0x40);
      auVar79 = *(undefined1 (*) [16])(ray + 0x50);
      auVar180._0_4_ = auVar99._0_4_ * auVar59._0_4_;
      auVar180._4_4_ = auVar99._4_4_ * auVar59._4_4_;
      auVar180._8_4_ = auVar99._8_4_ * auVar59._8_4_;
      auVar180._12_4_ = auVar99._12_4_ * auVar59._12_4_;
      auVar190 = vfmsub231ps_fma(auVar180,auVar58,auVar79);
      auVar57 = *(undefined1 (*) [16])(ray + 0x60);
      auVar161._0_4_ = auVar57._0_4_ * auVar83._0_4_;
      auVar161._4_4_ = auVar57._4_4_ * auVar83._4_4_;
      auVar161._8_4_ = auVar57._8_4_ * auVar83._8_4_;
      auVar161._12_4_ = auVar57._12_4_ * auVar83._12_4_;
      auVar90 = vfmadd231ps_fma(auVar161,auVar84,auVar79);
      auVar184._0_4_ = auVar79._0_4_ * auVar89._0_4_;
      auVar184._4_4_ = auVar79._4_4_ * auVar89._4_4_;
      auVar184._8_4_ = auVar79._8_4_ * auVar89._8_4_;
      auVar184._12_4_ = auVar79._12_4_ * auVar89._12_4_;
      auVar185 = vfmsub231ps_fma(auVar184,auVar59,auVar57);
      auVar189._0_4_ = auVar57._0_4_ * auVar58._0_4_;
      auVar189._4_4_ = auVar57._4_4_ * auVar58._4_4_;
      auVar189._8_4_ = auVar57._8_4_ * auVar58._8_4_;
      auVar189._12_4_ = auVar57._12_4_ * auVar58._12_4_;
      auVar181 = vfmsub231ps_fma(auVar189,auVar89,auVar99);
      auVar57 = vfmadd231ps_fma(auVar90,(undefined1  [16])vVar11.field_0,auVar99);
      auVar64._0_4_ = auVar166._0_4_ * auVar190._0_4_;
      auVar64._4_4_ = auVar166._4_4_ * auVar190._4_4_;
      auVar64._8_4_ = auVar166._8_4_ * auVar190._8_4_;
      auVar64._12_4_ = auVar166._12_4_ * auVar190._12_4_;
      auVar79 = vfmadd231ps_fma(auVar64,auVar181,auVar165);
      auVar99 = vandps_avx(auVar57,auVar104);
      auVar79 = vfmadd231ps_fma(auVar79,auVar185,auVar128);
      uVar40 = auVar99._0_4_;
      auVar105._0_4_ = (float)(uVar40 ^ auVar79._0_4_);
      uVar167 = auVar99._4_4_;
      auVar105._4_4_ = (float)(uVar167 ^ auVar79._4_4_);
      uVar170 = auVar99._8_4_;
      auVar105._8_4_ = (float)(uVar170 ^ auVar79._8_4_);
      uVar172 = auVar99._12_4_;
      auVar105._12_4_ = (float)(uVar172 ^ auVar79._12_4_);
      auVar87 = ZEXT1664(auVar65);
      auVar99 = vcmpps_avx(auVar105,_DAT_01f45a50,5);
      auVar79 = auVar65 & auVar99;
      if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar79[0xf])
      {
        auVar186 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      }
      else {
        auVar99 = vandps_avx(auVar99,auVar65);
        auVar67._0_4_ = auVar127._0_4_ * auVar190._0_4_;
        auVar67._4_4_ = auVar127._4_4_ * auVar190._4_4_;
        auVar67._8_4_ = auVar127._8_4_ * auVar190._8_4_;
        auVar67._12_4_ = auVar127._12_4_ * auVar190._12_4_;
        auVar79 = vfmadd213ps_fma(auVar113,auVar181,auVar67);
        auVar79 = vfmadd213ps_fma(auVar112,auVar185,auVar79);
        auVar121._0_4_ = (float)(uVar40 ^ auVar79._0_4_);
        auVar121._4_4_ = (float)(uVar167 ^ auVar79._4_4_);
        auVar121._8_4_ = (float)(uVar170 ^ auVar79._8_4_);
        auVar121._12_4_ = (float)(uVar172 ^ auVar79._12_4_);
        auVar79 = vcmpps_avx(auVar121,_DAT_01f45a50,5);
        auVar112 = auVar99 & auVar79;
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          auVar112 = vandps_avx(auVar57,auVar176);
          auVar99 = vandps_avx(auVar79,auVar99);
          auVar79 = vsubps_avx(auVar112,auVar105);
          auVar79 = vcmpps_avx(auVar79,auVar121,5);
          auVar113 = auVar99 & auVar79;
          if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar113[0xf] < '\0') {
            auVar99 = vandps_avx(auVar79,auVar99);
            auVar68._0_4_ = auVar89._0_4_ * auVar83._0_4_;
            auVar68._4_4_ = auVar89._4_4_ * auVar83._4_4_;
            auVar68._8_4_ = auVar89._8_4_ * auVar83._8_4_;
            auVar68._12_4_ = auVar89._12_4_ * auVar83._12_4_;
            auVar79 = vfmadd132ps_fma(auVar59,auVar68,auVar84);
            auVar79 = vfmadd213ps_fma(auVar58,(undefined1  [16])vVar11.field_0,auVar79);
            auVar136._0_4_ = uVar40 ^ auVar79._0_4_;
            auVar136._4_4_ = uVar167 ^ auVar79._4_4_;
            auVar136._8_4_ = uVar170 ^ auVar79._8_4_;
            auVar136._12_4_ = uVar172 ^ auVar79._12_4_;
            auVar69._0_4_ = auVar112._0_4_ * *(float *)(ray + 0x30);
            auVar69._4_4_ = auVar112._4_4_ * *(float *)(ray + 0x34);
            auVar69._8_4_ = auVar112._8_4_ * *(float *)(ray + 0x38);
            auVar69._12_4_ = auVar112._12_4_ * *(float *)(ray + 0x3c);
            auVar146._0_4_ = auVar112._0_4_ * *(float *)(ray + 0x80);
            auVar146._4_4_ = auVar112._4_4_ * *(float *)(ray + 0x84);
            auVar146._8_4_ = auVar112._8_4_ * *(float *)(ray + 0x88);
            auVar146._12_4_ = auVar112._12_4_ * *(float *)(ray + 0x8c);
            auVar79 = vcmpps_avx(auVar69,auVar136,1);
            auVar113 = vcmpps_avx(auVar136,auVar146,2);
            auVar79 = vandps_avx(auVar113,auVar79);
            auVar113 = auVar99 & auVar79;
            if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar113[0xf] < '\0') {
              auVar99 = vandps_avx(auVar99,auVar79);
              auVar79 = vcmpps_avx(auVar57,_DAT_01f45a50,4);
              auVar57 = auVar99 & auVar79;
              if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar57[0xf] < '\0') {
                auVar99 = vandps_avx(auVar79,auVar99);
                uVar167 = *(uint *)(lVar53 + 0x40 + lVar50 * 4);
                pGVar7 = (context->scene->geometries).items[uVar167].ptr;
                local_3848 = (undefined1  [8])pGVar7;
                uVar40 = pGVar7->mask;
                auVar70._4_4_ = uVar40;
                auVar70._0_4_ = uVar40;
                auVar70._8_4_ = uVar40;
                auVar70._12_4_ = uVar40;
                auVar79 = vpand_avx(auVar70,*(undefined1 (*) [16])(ray + 0x90));
                auVar79 = vpcmpeqd_avx(auVar79,_DAT_01f45a50);
                auVar57 = auVar99 & ~auVar79;
                if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar57[0xf] < '\0') {
                  local_3928 = vandnps_avx(auVar79,auVar99);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar99 = vrcpps_avx(auVar112);
                    auVar147._8_4_ = 0x3f800000;
                    auVar147._0_8_ = 0x3f8000003f800000;
                    auVar147._12_4_ = 0x3f800000;
                    auVar79 = vfnmadd213ps_fma(auVar112,auVar99,auVar147);
                    auVar79 = vfmadd132ps_fma(auVar79,auVar99,auVar99);
                    auVar107._0_4_ = auVar79._0_4_ * auVar105._0_4_;
                    auVar107._4_4_ = auVar79._4_4_ * auVar105._4_4_;
                    auVar107._8_4_ = auVar79._8_4_ * auVar105._8_4_;
                    auVar107._12_4_ = auVar79._12_4_ * auVar105._12_4_;
                    auVar99 = vminps_avx(auVar107,auVar147);
                    auVar122._0_4_ = auVar79._0_4_ * auVar121._0_4_;
                    auVar122._4_4_ = auVar79._4_4_ * auVar121._4_4_;
                    auVar122._8_4_ = auVar79._8_4_ * auVar121._8_4_;
                    auVar122._12_4_ = auVar79._12_4_ * auVar121._12_4_;
                    auVar79 = vminps_avx(auVar122,auVar147);
                    auVar57 = vsubps_avx(auVar147,auVar99);
                    auVar112 = vsubps_avx(auVar147,auVar79);
                    auVar12._8_8_ = uVar20;
                    auVar12._0_8_ = uVar19;
                    vblendvps_avx(auVar99,auVar57,auVar12);
                    vblendvps_avx(auVar79,auVar112,auVar12);
                    local_3868 = auVar84._0_8_;
                    uStack_3860 = auVar84._8_8_;
                    p0.field_0._16_8_ = local_3868;
                    p0.field_0._24_8_ = uStack_3860;
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v_2;
                    p1.field_0._24_8_ = &u;
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar11.field_0;
                    p0.field_0._32_16_ = auVar83;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                    p0.field_0._16_8_ = local_3718;
                    p0.field_0._24_8_ = uStack_3710;
                    p0.field_0._40_8_ = uStack_3700;
                    p0.field_0._32_8_ = uStack_3708;
                    auVar75 = ZEXT1632(CONCAT412(uVar167,CONCAT48(uVar167,CONCAT44(uVar167,uVar167))
                                                ));
                    vpcmpeqd_avx2(auVar75,auVar75);
                    auVar99 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar79 = vblendvps_avx(auVar99,(undefined1  [16])t.field_0,local_3928);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar79;
                    p1.field_0._0_8_ = local_3858;
                    p1.field_0._8_8_ = *(undefined8 *)((long)local_3848 + 0x18);
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p1.field_0._24_8_ = ray;
                    local_3858 = local_3928;
                    if (*(code **)((long)local_3848 + 0x48) != (code *)0x0) {
                      (**(code **)((long)local_3848 + 0x48))(&p1);
                    }
                    if (local_3858 == (undefined1  [16])0x0) {
                      auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar79 = auVar79 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_3848 + 0x3e) & 0x40) != 0)))) {
                        (*p_Var9)((RTCFilterFunctionNArguments *)&p1);
                      }
                      auVar57 = vpcmpeqd_avx(local_3858,_DAT_01f45a50);
                      auVar79 = auVar57 ^ _DAT_01f46b70;
                      auVar95._8_4_ = 0xff800000;
                      auVar95._0_8_ = 0xff800000ff800000;
                      auVar95._12_4_ = 0xff800000;
                      auVar57 = vblendvps_avx(auVar95,*(undefined1 (*) [16])
                                                       (p1.field_0._24_8_ + 0x80),auVar57);
                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar57;
                    }
                    auVar79 = vpslld_avx(auVar79,0x1f);
                    local_3928 = vpsrad_avx(auVar79,0x1f);
                    auVar99 = vblendvps_avx(auVar99,*(undefined1 (*) [16])pRVar1,auVar79);
                    *(undefined1 (*) [16])pRVar1 = auVar99;
                  }
                  auVar65 = vandnps_avx(local_3928,auVar65);
                }
              }
            }
            auVar186 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar87 = ZEXT1664(auVar65);
            goto LAB_01641509;
          }
        }
        auVar186 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar87 = ZEXT1664(auVar65);
      }
LAB_01641509:
      lVar50 = lVar50 + 1;
      auVar65 = auVar87._0_16_;
    } while ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar87[0xf] < '\0');
    auVar87 = ZEXT1664(local_37a8);
    auVar79 = vandps_avx(auVar65,local_37a8);
    lVar48 = lVar48 + 1;
    auVar65 = local_37a8 & auVar65;
    auVar99 = local_37a8;
    local_37a8 = auVar79;
  } while ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar65[0xf] < '\0');
  auVar99 = vpcmpeqd_avx(auVar99,auVar99);
  auVar74._0_4_ = local_37a8._0_4_ ^ auVar99._0_4_;
  auVar74._4_4_ = local_37a8._4_4_ ^ auVar99._4_4_;
  auVar74._8_4_ = local_37a8._8_4_ ^ auVar99._8_4_;
  auVar74._12_4_ = local_37a8._12_4_ ^ auVar99._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar74,(undefined1  [16])vVar38.field_0);
  auVar99 = auVar99 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar99[0xf])
  goto LAB_016423a3;
  auVar87 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar98._8_4_ = 0xff800000;
  auVar98._0_8_ = 0xff800000ff800000;
  auVar98._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar98,
                     (undefined1  [16])terminated.field_0);
  goto LAB_01640d98;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }